

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O3

void draw_statuses(nh_player_info *pi,nh_bool threeline)

{
  long lVar1;
  int iVar2;
  attr_t aVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  char (*__s) [12];
  anon_struct_16_2_f748c203 *paVar8;
  
  if (statuswin == (WINDOW *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (long)statuswin->_maxx + 2;
  }
  if (0 < player.nr_items) {
    lVar7 = 0;
    do {
      __s = player.statusitems + lVar7;
      sVar4 = strlen(*__s);
      iVar2 = strcmp(*__s,"Burdened");
      paVar8 = statuscolors;
      if (iVar2 != 0) {
        lVar1 = 0;
        do {
          lVar5 = lVar1;
          if (lVar5 + 0x10 == 0x210) {
            iVar2 = 0xf;
            goto LAB_00117ae0;
          }
          iVar2 = strcmp(*__s,*(char **)((long)&statuscolors[1].name + lVar5));
          lVar1 = lVar5 + 0x10;
        } while (iVar2 != 0);
        paVar8 = (anon_struct_16_2_f748c203 *)(lVar5 + 0x123b60);
      }
      iVar2 = paVar8->color;
LAB_00117ae0:
      uVar6 = (long)(int)uVar6 + ~sVar4;
      aVar3 = curses_color_attr(iVar2,0);
      wmove(statuswin,2 - (uint)((char)pi == '\0'),uVar6 & 0xffffffff);
      wattr_on(statuswin,aVar3,0);
      wprintw(statuswin,"%s",__s);
      wattr_off(statuswin,aVar3,0);
      lVar7 = lVar7 + 1;
    } while (lVar7 < player.nr_items);
  }
  return;
}

Assistant:

static void draw_statuses(const struct nh_player_info *pi, nh_bool threeline)
{
    int i, j, k;

    j = getmaxx(statuswin) + 1;
    for (i = 0; i < pi->nr_items; i++) {
	attr_t colorattr;
	int color = CLR_WHITE;
	j -= strlen(pi->statusitems[i]) + 1;
	for (k = 0; statuscolors[k].name; k++) {
	    if (!strcmp(pi->statusitems[i], statuscolors[k].name)) {
		color = statuscolors[k].color;
		break;
	    }
	}
	colorattr = curses_color_attr(color, 0);
	wmove(statuswin, (threeline ? 2 : 1), j);
	wattron(statuswin, colorattr);
	wprintw(statuswin, "%s", pi->statusitems[i]);
	wattroff(statuswin, colorattr);
    }
}